

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int rtreeOpen(sqlite3_vtab *pVTab,sqlite3_vtab_cursor **ppCursor)

{
  int iVar1;
  sqlite3_vtab_cursor *psVar2;
  sqlite3_vtab_cursor *psVar3;
  int iVar4;
  
  iVar1 = sqlite3_initialize();
  iVar4 = 7;
  if (iVar1 == 0) {
    psVar2 = (sqlite3_vtab_cursor *)sqlite3Malloc(0x128);
    psVar3 = (sqlite3_vtab_cursor *)0x0;
    if (psVar2 != (sqlite3_vtab_cursor *)0x0) {
      memset(psVar2 + 1,0,0x120);
      psVar2->pVtab = pVTab;
      pVTab[3].nRef = pVTab[3].nRef + 1;
      iVar4 = 0;
      psVar3 = psVar2;
    }
  }
  else {
    psVar3 = (sqlite3_vtab_cursor *)0x0;
  }
  *ppCursor = psVar3;
  return iVar4;
}

Assistant:

static int rtreeOpen(sqlite3_vtab *pVTab, sqlite3_vtab_cursor **ppCursor){
  int rc = SQLITE_NOMEM;
  Rtree *pRtree = (Rtree *)pVTab;
  RtreeCursor *pCsr;

  pCsr = (RtreeCursor *)sqlite3_malloc64(sizeof(RtreeCursor));
  if( pCsr ){
    memset(pCsr, 0, sizeof(RtreeCursor));
    pCsr->base.pVtab = pVTab;
    rc = SQLITE_OK;
    pRtree->nCursor++;
  }
  *ppCursor = (sqlite3_vtab_cursor *)pCsr;

  return rc;
}